

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  TestResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ostream *poVar3;
  size_t width;
  size_t width_00;
  size_t width_01;
  TimeInMillis ms;
  TimeInMillis ms_00;
  _Alloc_hider _Var4;
  char *pcVar5;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  string kIndent;
  string kTestsuite;
  
  std::__cxx11::string::string((string *)&kTestsuite,"testcase",(allocator *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0xa,width);
  Indent_abi_cxx11_(&local_a0,(internal *)&DAT_00000008,width_00);
  poVar3 = std::operator<<(stream,(string *)&local_a0);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"name",&local_a2);
  std::__cxx11::string::string((string *)&local_80,(test_info->name_)._M_dataplus._M_p,&local_a1);
  OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  pbVar1 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string((string *)&local_a0,"value_param",&local_a2);
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var4._M_p = (char *)0x0;
    }
    else {
      _Var4._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_80,_Var4._M_p,&local_a1);
    OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  pbVar1 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string((string *)&local_a0,"type_param",&local_a2);
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var4._M_p = (char *)0x0;
    }
    else {
      _Var4._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_80,_Var4._M_p,&local_a1);
    OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::string((string *)&local_a0,"file",&local_a2);
  std::__cxx11::string::string
            ((string *)&local_80,(test_info->location_).file._M_dataplus._M_p,&local_a1);
  OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"line",(allocator *)&local_80);
  OutputJsonKey(stream,&kTestsuite,&local_a0,(test_info->location_).line,&kIndent,false);
  std::__cxx11::string::~string((string *)&local_a0);
  if (FLAGS_gtest_list_tests == '\x01') {
    poVar3 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_a0,(internal *)&DAT_00000008,width_01);
    poVar3 = std::operator<<(poVar3,(string *)&local_a0);
    std::operator<<(poVar3,"}");
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    std::operator<<(stream,",\n");
    std::__cxx11::string::string((string *)&local_a0,"status",&local_a2);
    pcVar5 = "NOTRUN";
    if (test_info->should_run_ != false) {
      pcVar5 = "RUN";
    }
    std::__cxx11::string::string((string *)&local_80,pcVar5,&local_a1);
    OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_a0,"result",&local_a2);
    this = &test_info->result_;
    if (test_info->should_run_ == true) {
      bVar2 = TestResult::Skipped(this);
      pcVar5 = "COMPLETED";
      if (bVar2) {
        pcVar5 = "SKIPPED";
      }
    }
    else {
      pcVar5 = "SUPPRESSED";
    }
    std::__cxx11::string::string((string *)&local_80,pcVar5,&local_a1);
    OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_a0,"timestamp",&local_a2);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_80,(internal *)(test_info->result_).start_timestamp_,ms);
    OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_a0,"time",&local_a2);
    FormatTimeInMillisAsDuration_abi_cxx11_
              (&local_80,(internal *)(test_info->result_).elapsed_time_,ms_00);
    OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_a0,"classname",&local_a2);
    std::__cxx11::string::string((string *)&local_80,test_suite_name,&local_a1);
    OutputJsonKey(stream,&kTestsuite,&local_a0,&local_80,&kIndent,false);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    TestPropertiesAsJson(&local_a0,this,&kIndent);
    std::operator<<(stream,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    OutputJsonTestResult(stream,this);
  }
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuite);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }

  OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
  OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
  if (GTEST_FLAG_GET(list_tests)) {
    *stream << "\n" << Indent(8) << "}";
    return;
  } else {
    *stream << ",\n";
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  OutputJsonTestResult(stream, result);
}